

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_seek(cram_fd *fd,off_t offset,int whence)

{
  off_t oVar1;
  size_t sVar2;
  int iVar3;
  size_t nbytes;
  char buf [65536];
  
  fd->ooc = 0;
  oVar1 = hseek(fd->fp,offset,whence);
  iVar3 = 0;
  if (oVar1 < 0) {
    if (offset < 0 || whence != 1) {
      iVar3 = -1;
    }
    else {
      do {
        if (offset < 1) {
          return 0;
        }
        nbytes = 0x10000;
        if ((ulong)offset < 0x10000) {
          nbytes = offset;
        }
        sVar2 = hread(fd->fp,buf,nbytes);
        offset = offset - nbytes;
      } while (nbytes == sVar2);
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int cram_seek(cram_fd *fd, off_t offset, int whence) {
    char buf[65536];

    fd->ooc = 0;

    if (hseek(fd->fp, offset, whence) >= 0)
	return 0;

    if (!(whence == SEEK_CUR && offset >= 0))
	return -1;

    /* Couldn't fseek, but we're in SEEK_CUR mode so read instead */
    while (offset > 0) {
	int len = MIN(65536, offset);
	if (len != hread(fd->fp, buf, len))
	    return -1;
	offset -= len;
    }

    return 0;
}